

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O1

bool duckdb::AddPropagateStatistics::Operation<long,duckdb::TryDecimalAdd>
               (LogicalType *type,BaseStatistics *lstats,BaseStatistics *rstats,Value *new_min,
               Value *new_max)

{
  bool bVar1;
  long lVar2;
  long value;
  long value_00;
  Value local_70;
  
  lVar2 = NumericStats::GetMin<long>(lstats);
  value = NumericStats::GetMin<long>(rstats);
  if (value < 0) {
    if (lVar2 < -999999999999999999 - value) goto LAB_00969b7b;
LAB_00969b91:
    value = value + lVar2;
    bVar1 = true;
  }
  else {
    if (lVar2 <= 999999999999999999 - value) goto LAB_00969b91;
LAB_00969b7b:
    bVar1 = false;
  }
  if (!bVar1) {
    return true;
  }
  lVar2 = NumericStats::GetMax<long>(lstats);
  value_00 = NumericStats::GetMax<long>(rstats);
  if (value_00 < 0) {
    if (lVar2 < -999999999999999999 - value_00) goto LAB_00969bce;
  }
  else if (999999999999999999 - value_00 < lVar2) {
LAB_00969bce:
    bVar1 = false;
    goto LAB_00969be9;
  }
  value_00 = value_00 + lVar2;
  bVar1 = true;
LAB_00969be9:
  if (bVar1) {
    Value::Numeric(&local_70,type,value);
    Value::operator=(new_min,&local_70);
    Value::~Value(&local_70);
    Value::Numeric(&local_70,type,value_00);
    Value::operator=(new_max,&local_70);
    Value::~Value(&local_70);
  }
  return !bVar1;
}

Assistant:

static bool Operation(const LogicalType &type, BaseStatistics &lstats, BaseStatistics &rstats, Value &new_min,
	                      Value &new_max) {
		T min, max;
		// new min is min+min
		if (!OP::Operation(NumericStats::GetMin<T>(lstats), NumericStats::GetMin<T>(rstats), min)) {
			return true;
		}
		// new max is max+max
		if (!OP::Operation(NumericStats::GetMax<T>(lstats), NumericStats::GetMax<T>(rstats), max)) {
			return true;
		}
		new_min = Value::Numeric(type, min);
		new_max = Value::Numeric(type, max);
		return false;
	}